

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookahead_matcher.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::
lookahead_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
::
match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (void *param_1,
          match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_2,long *param_3)

{
  char *pcVar1;
  undefined1 uVar2;
  bool bVar3;
  ulong uVar4;
  save_restore<bool> partial_match;
  memento<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mem;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmp;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff68;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *state;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  byte local_9;
  
  pcVar1 = (param_2->cur_)._M_current;
  save_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (in_stack_ffffffffffffffa0);
  if ((*(byte *)((long)param_1 + 8) & 1) == 0) {
    bVar3 = shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::match((shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff58);
    if (!bVar3) {
      restore_action_queue<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((memento<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffffa0,param_2);
      reclaim_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((memento<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,(bool)in_stack_ffffffffffffff67);
      local_9 = 0;
      goto LAB_0016ff24;
    }
    (param_2->cur_)._M_current = pcVar1;
    restore_action_queue<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((memento<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stack0xffffffffffffffa0,param_2);
    uVar4 = (**(code **)(*param_3 + 0x10))(param_3,param_2);
    if ((uVar4 & 1) != 0) {
      reclaim_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((memento<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68,(bool)in_stack_ffffffffffffff67);
      local_9 = 1;
      goto LAB_0016ff24;
    }
    restore_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((memento<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68);
  }
  else {
    state = (match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xffffffffffffff90;
    save_restore<bool>::save_restore((save_restore<bool> *)state,&param_2->found_partial_match_);
    uVar2 = shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::match((shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff58);
    if ((bool)uVar2) {
      restore_action_queue<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((memento<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffffa0,param_2);
      restore_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((memento<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT17(uVar2,in_stack_ffffffffffffff70),state);
      (param_2->cur_)._M_current = pcVar1;
      local_9 = 0;
      bVar3 = true;
    }
    else {
      restore_action_queue<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((memento<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffffa0,param_2);
      bVar3 = (bool)(**(code **)(*param_3 + 0x10))(param_3,param_2);
      if ((bVar3 & 1U) == 0) {
        reclaim_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((memento<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(uVar2,in_stack_ffffffffffffff70),state,bVar3);
        bVar3 = false;
      }
      else {
        reclaim_sub_matches<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((memento<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(uVar2,in_stack_ffffffffffffff70),state,bVar3);
        local_9 = 1;
        bVar3 = true;
      }
    }
    save_restore<bool>::~save_restore((save_restore<bool> *)&stack0xffffffffffffff90);
    if (bVar3) goto LAB_0016ff24;
  }
  local_9 = 0;
LAB_0016ff24:
  return (bool)(local_9 & 1);
}

Assistant:

bool match_(match_state<BidiIter> &state, Next const &next, mpl::false_) const
        {
            BidiIter const tmp = state.cur_;

            // matching xpr could produce side-effects, save state
            memento<BidiIter> mem = save_sub_matches(state);

            if(this->not_)
            {
                // negative look-ahead assertions do not trigger partial matches.
                save_restore<bool> partial_match(state.found_partial_match_);
                detail::ignore_unused(partial_match);

                if(this->xpr_.match(state))
                {
                    restore_action_queue(mem, state);
                    restore_sub_matches(mem, state);
                    state.cur_ = tmp;
                    return false;
                }
                restore_action_queue(mem, state);
                if(next.match(state))
                {
                    reclaim_sub_matches(mem, state, true);
                    return true;
                }
                reclaim_sub_matches(mem, state, false);
            }
            else
            {
                if(!this->xpr_.match(state))
                {
                    restore_action_queue(mem, state);
                    reclaim_sub_matches(mem, state, false);
                    return false;
                }
                state.cur_ = tmp;
                restore_action_queue(mem, state);
                if(next.match(state))
                {
                    reclaim_sub_matches(mem, state, true);
                    return true;
                }
                restore_sub_matches(mem, state);
            }

            BOOST_ASSERT(state.cur_ == tmp);
            return false;
        }